

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O3

void __thiscall FfsParser::~FfsParser(FfsParser *this)

{
  NvramParser *pNVar1;
  MeParser *pMVar2;
  FitParser *this_00;
  Data *pDVar3;
  Data *pDVar4;
  
  pNVar1 = this->nvramParser;
  if (pNVar1 != (NvramParser *)0x0) {
    std::vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
    ::~vector(&pNVar1->messagesVector);
  }
  operator_delete(pNVar1,0x28);
  pMVar2 = this->meParser;
  if (pMVar2 != (MeParser *)0x0) {
    std::vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
    ::~vector(&pMVar2->messagesVector);
  }
  operator_delete(pMVar2,0x28);
  this_00 = this->fitParser;
  if (this_00 != (FitParser *)0x0) {
    FitParser::~FitParser(this_00);
  }
  operator_delete(this_00,0xa8);
  std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::~vector(&this->protectedRanges);
  pDVar3 = (this->securityInfo).d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->securityInfo).d.d)->super_QArrayData,2,8);
    }
  }
  pDVar4 = (this->openedImage).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->openedImage).d.d)->super_QArrayData,1,8);
    }
  }
  std::vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>::
  ~vector(&this->messagesVector);
  return;
}

Assistant:

FfsParser::~FfsParser() {
    delete nvramParser;
    delete meParser;
    delete fitParser;
}